

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::InitGLExtension::exec(InitGLExtension *this,Thread *t)

{
  ostream *poVar1;
  string *__rhs;
  __type_conflict _Var2;
  bool bVar3;
  pointer pcVar4;
  char *__s;
  long lVar5;
  undefined8 uVar6;
  NotSupportedError *this_00;
  bool bVar7;
  string extensions;
  string extension;
  string local_50 [32];
  
  pcVar4 = (pointer)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pcVar4 == (pointer)0x0) {
    __cxa_bad_cast();
  }
  extension._M_dataplus._M_p = pcVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)&extension._M_string_length);
  std::operator<<((ostream *)((long)&extension.field_2 + 8),"Begin -- glGetString(GL_EXTENSIONS)");
  tcu::ThreadUtil::MessageBuilder::operator<<
            ((MessageBuilder *)&extension,(EndToken *)&tcu::ThreadUtil::Message::End);
  std::__cxx11::stringstream::~stringstream((stringstream *)&extension._M_string_length);
  __s = (char *)(**(code **)(*(long *)(pcVar4 + 0x88) + 0xa78))(0x1f03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extensions,__s,(allocator<char> *)&extension);
  extension._M_dataplus._M_p = pcVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)&extension._M_string_length);
  std::operator<<((ostream *)((long)&extension.field_2 + 8),"End -- glGetString()");
  tcu::ThreadUtil::MessageBuilder::operator<<
            ((MessageBuilder *)&extension,(EndToken *)&tcu::ThreadUtil::Message::End);
  std::__cxx11::stringstream::~stringstream((stringstream *)&extension._M_string_length);
  lVar5 = std::__cxx11::string::find((char *)&extensions,0x19187f2);
  __rhs = &this->m_extension;
  bVar3 = false;
  do {
    extension._M_dataplus._M_p = (pointer)&extension.field_2;
    extension._M_string_length = 0;
    extension.field_2._M_local_buf[0] = '\0';
    if (lVar5 == -1) {
      std::__cxx11::string::_M_assign((string *)&extension);
      std::__cxx11::string::assign((char *)&extensions);
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&extensions);
      std::__cxx11::string::operator=((string *)&extension,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::substr((ulong)local_50,(ulong)&extensions);
      std::__cxx11::string::operator=((string *)&extensions,local_50);
      std::__cxx11::string::~string(local_50);
    }
    _Var2 = std::operator==(&extension,__rhs);
    bVar7 = true;
    if (!_Var2) {
      lVar5 = std::__cxx11::string::find((char *)&extensions,0x19187f2);
      bVar7 = bVar3;
    }
    std::__cxx11::string::~string((string *)&extension);
    bVar3 = bVar7;
  } while ((~_Var2 & lVar5 != -1) != 0);
  if (bVar7) {
    bVar3 = std::operator==(__rhs,"GL_OES_EGL_image");
    if (bVar3) {
      extension._M_dataplus._M_p = pcVar4;
      std::__cxx11::stringstream::stringstream((stringstream *)&extension._M_string_length);
      std::operator<<((ostream *)((long)&extension.field_2 + 8),
                      "Begin -- eglGetProcAddress(\"glEGLImageTargetTexture2DOES\")");
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)&extension,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)&extension._M_string_length);
      uVar6 = (**(code **)(**(long **)(pcVar4 + 0x80) + 0x110))
                        (*(long **)(pcVar4 + 0x80),"glEGLImageTargetTexture2DOES");
      *(undefined8 *)(*(long *)(pcVar4 + 0xb0) + 0x58) = uVar6;
      extension._M_dataplus._M_p = pcVar4;
      std::__cxx11::stringstream::stringstream((stringstream *)&extension._M_string_length);
      poVar1 = (ostream *)(&extension.field_2._M_allocated_capacity + 1);
      std::operator<<(poVar1,"End --  ");
      std::ostream::_M_insert<void_const*>(poVar1);
      std::operator<<(poVar1," = eglGetProcAddress()");
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)&extension,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)&extension._M_string_length);
    }
    std::__cxx11::string::~string((string *)&extensions);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::operator+(&extension,__rhs," not supported");
  tcu::NotSupportedError::NotSupportedError
            (this_00,extension._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
             ,0x30b);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InitGLExtension::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	// Check extensions
	bool found = false;

	thread.newMessage() << "Begin -- glGetString(GL_EXTENSIONS)" << tcu::ThreadUtil::Message::End;
	std::string extensions = (const char*)thread.gl.getString(GL_EXTENSIONS);
	thread.newMessage() << "End -- glGetString()" << tcu::ThreadUtil::Message::End;

	std::string::size_type pos = extensions.find(" ");

	do
	{
		std::string extension;
		if (pos != std::string::npos)
		{
			extension = extensions.substr(0, pos);
			extensions = extensions.substr(pos+1);
		}
		else
		{
			extension = extensions;
			extensions = "";
		}

		if (extension == m_extension)
		{
			found = true;
			break;
		}
		pos = extensions.find(" ");
	} while (pos != std::string::npos);

	if (!found)
		throw tcu::NotSupportedError((m_extension + " not supported").c_str(), "", __FILE__, __LINE__);


	// Query function pointers
	if (m_extension == "GL_OES_EGL_image")
	{
		thread.newMessage() << "Begin -- eglGetProcAddress(\"glEGLImageTargetTexture2DOES\")" << tcu::ThreadUtil::Message::End;
		thread.runtimeContext->glExtensions.imageTargetTexture2D = (glEGLImageTargetTexture2DOESFunc)thread.egl.getProcAddress("glEGLImageTargetTexture2DOES");
		thread.newMessage() << "End --  " << ((void*)thread.runtimeContext->glExtensions.imageTargetTexture2D) << " = eglGetProcAddress()"<< tcu::ThreadUtil::Message::End;
	}
}